

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O0

void ssh_ntru_server_free(ecdh_key *dh)

{
  ntru_server_key *nk;
  ecdh_key *dh_local;
  
  ring_free((uint16_t *)dh[-4].vt,0x2f9);
  strbuf_free((strbuf *)dh[-3].vt);
  strbuf_free((strbuf *)dh[-2].vt);
  ecdh_key_free((ecdh_key *)dh[-1].vt);
  safefree(dh + -4);
  return;
}

Assistant:

static void ssh_ntru_server_free(ecdh_key *dh)
{
    ntru_server_key *nk = container_of(dh, ntru_server_key, ek);
    ring_free(nk->plaintext, p_LIVE);
    strbuf_free(nk->ciphertext_encoded);
    strbuf_free(nk->confirmation_hash);
    ecdh_key_free(nk->curve25519);
    sfree(nk);
}